

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,long,duckdb::UnaryOperatorWrapper,duckdb::GraphemeCountOperator>
               (string_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TemplatedValidityData<unsigned_long> *pTVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long *plVar9;
  ulong uVar10;
  char *pcVar11;
  unsigned_long uVar12;
  idx_t iVar13;
  undefined8 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  long *local_60;
  ValidityMask *local_58;
  idx_t local_50;
  ulong local_48;
  ulong local_40;
  idx_t local_38;
  
  local_58 = mask;
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_50 = count;
  local_60 = result_data;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar13 = 0;
      do {
        local_78 = *(element_type **)&ldata[iVar13].value;
        p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[iVar13].value.pointer.ptr
        ;
        pcVar11 = (char *)p_Stack_70;
        if (((ulong)local_78 & 0xffffffff) < 0xd) {
          pcVar11 = (char *)((long)&local_78 + 4);
        }
        uVar10 = (ulong)local_78 & 0xffffffff;
        if (uVar10 != 0) {
          uVar6 = 0;
          do {
            if (pcVar11[uVar6] < '\0') {
              uVar10 = Utf8Proc::GraphemeCount(pcVar11,uVar10);
              result_data = local_60;
              break;
            }
            uVar6 = uVar6 + 1;
          } while (uVar10 != uVar6);
        }
        result_data[iVar13] = uVar10;
        iVar13 = iVar13 + 1;
      } while (iVar13 != local_50);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long **)mask,&local_38);
      p_Var3 = p_Stack_70;
      peVar2 = local_78;
      local_78 = (element_type *)0x0;
      p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
      }
      pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar4->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_48 = count + 0x3f >> 6;
      local_40 = 0;
      plVar9 = local_60;
      uVar10 = 0;
      do {
        puVar1 = (local_58->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar12 = 0xffffffffffffffff;
        }
        else {
          uVar12 = puVar1[local_40];
        }
        uVar6 = uVar10 + 0x40;
        if (local_50 <= uVar10 + 0x40) {
          uVar6 = local_50;
        }
        uVar5 = uVar6;
        if (uVar12 != 0) {
          uVar5 = uVar10;
          if (uVar12 == 0xffffffffffffffff) {
            if (uVar10 < uVar6) {
              do {
                local_78 = *(element_type **)&ldata[uVar10].value;
                p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             ldata[uVar10].value.pointer.ptr;
                pcVar11 = (char *)p_Stack_70;
                if (((ulong)local_78 & 0xffffffff) < 0xd) {
                  pcVar11 = (char *)((long)&local_78 + 4);
                }
                uVar5 = (ulong)local_78 & 0xffffffff;
                if (uVar5 != 0) {
                  uVar7 = 0;
                  do {
                    if (pcVar11[uVar7] < '\0') {
                      uVar5 = Utf8Proc::GraphemeCount(pcVar11,uVar5);
                      plVar9 = local_60;
                      break;
                    }
                    uVar7 = uVar7 + 1;
                  } while (uVar5 != uVar7);
                }
                plVar9[uVar10] = uVar5;
                uVar10 = uVar10 + 1;
                uVar5 = uVar10;
              } while (uVar10 != uVar6);
            }
          }
          else if (uVar10 < uVar6) {
            do {
              if ((uVar12 >> ((ulong)(uint)((int)uVar5 - (int)uVar10) & 0x3f) & 1) != 0) {
                local_78 = *(element_type **)&ldata[uVar5].value;
                p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             ldata[uVar5].value.pointer.ptr;
                pcVar11 = (char *)p_Stack_70;
                if (((ulong)local_78 & 0xffffffff) < 0xd) {
                  pcVar11 = (char *)((long)&local_78 + 4);
                }
                uVar7 = (ulong)local_78 & 0xffffffff;
                if (uVar7 != 0) {
                  uVar8 = 0;
                  do {
                    if (pcVar11[uVar8] < '\0') {
                      uVar7 = Utf8Proc::GraphemeCount(pcVar11,uVar7);
                      plVar9 = local_60;
                      break;
                    }
                    uVar8 = uVar8 + 1;
                  } while (uVar7 != uVar8);
                }
                plVar9[uVar5] = uVar7;
              }
              uVar5 = uVar5 + 1;
            } while (uVar5 != uVar6);
          }
        }
        local_40 = local_40 + 1;
        uVar10 = uVar5;
      } while (local_40 != local_48);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}